

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

char * cram_get_ref(cram_fd *fd,int id,int start,int end)

{
  refs_t **pprVar1;
  int64_t *piVar2;
  pthread_mutex_t *__mutex;
  long lVar3;
  ref_entry *prVar4;
  size_t __n;
  bool bVar5;
  int iVar6;
  int iVar7;
  ref_entry *prVar8;
  BGZF *pBVar9;
  SAM_hdr_type *type;
  SAM_hdr_tag *pSVar10;
  mFILE *mf;
  FILE *__s;
  int *piVar11;
  refs_t *prVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  ref_entry *e;
  uint start_00;
  char path_tmp [4096];
  char path [4096];
  char cache [4096];
  char *local_3060;
  stat local_3038 [28];
  char local_2038 [4096];
  char local_1038 [4104];
  
  if (id == -1) {
    return (char *)0x0;
  }
  __mutex = &fd->ref_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (fd->unsorted != 0) {
    fd->shared_ref = 1;
  }
  prVar12 = fd->refs;
  if (prVar12->nref <= id) {
    pcVar15 = (char *)0x0;
    fprintf(_stderr,"No reference found for id %d\n",(ulong)(uint)id);
    goto LAB_0012f2c0;
  }
  if (prVar12 != (refs_t *)0x0) {
    e = prVar12->ref_id[id];
    if (e != (ref_entry *)0x0) {
      pprVar1 = &fd->refs;
      pthread_mutex_lock((pthread_mutex_t *)&prVar12->lock);
      if (e->length == 0) {
        pcVar15 = getenv("REF_PATH");
        local_3060 = getenv("REF_CACHE");
        if (fd->verbose != 0) {
          fprintf(_stderr,"cram_populate_ref on fd %p, id %d\n",fd,(ulong)(uint)id);
        }
        if ((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) {
          if ((local_3060 == (char *)0x0) || (*local_3060 == '\0')) {
            pcVar15 = getenv("XDG_CACHE_HOME");
            if ((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) {
              pcVar15 = getenv("HOME");
              if ((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) {
                pcVar15 = getenv("TMPDIR");
                if (((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) &&
                   ((pcVar15 = getenv("TEMP"), pcVar15 == (char *)0x0 || (*pcVar15 == '\0')))) {
                  pcVar15 = "/tmp";
                }
                goto LAB_0012f391;
              }
              pcVar14 = "/.cache";
            }
            else {
LAB_0012f391:
              pcVar14 = "";
            }
            local_3060 = local_1038;
            snprintf(local_3060,0x1000,"%s%s/hts-ref/%%2s/%%2s/%%s",pcVar15,pcVar14);
            pcVar15 = "http://www.ebi.ac.uk:80/ena/cram/md5/%s";
            if (fd->verbose != 0) {
              local_3060 = local_1038;
              fprintf(_stderr,"Populating local cache: %s\n");
            }
          }
          else {
            pcVar15 = "http://www.ebi.ac.uk:80/ena/cram/md5/%s";
          }
        }
        if ((e->name == (char *)0x0) ||
           (type = sam_hdr_find(fd->header,"SQ","SN",e->name), type == (SAM_hdr_type *)0x0)) {
LAB_0012f679:
          iVar6 = -1;
        }
        else {
          iVar6 = 0;
          pSVar10 = sam_hdr_find_key(fd->header,type,"M5",(SAM_hdr_tag **)0x0);
          if (pSVar10 == (SAM_hdr_tag *)0x0) {
LAB_0012f58e:
            pSVar10 = sam_hdr_find_key(fd->header,type,"UR",(SAM_hdr_tag **)0x0);
            if (pSVar10 != (SAM_hdr_tag *)0x0) {
              pcVar14 = pSVar10->str;
              pcVar15 = pcVar14 + 3;
              iVar6 = strncmp(pcVar15,"file:",5);
              pcVar14 = pcVar14 + 8;
              if (iVar6 != 0) {
                pcVar14 = pcVar15;
              }
              if ((*pprVar1)->fp != (BGZF *)0x0) {
                iVar6 = bgzf_close((*pprVar1)->fp);
                if (iVar6 != 0) goto LAB_0012f679;
                (*pprVar1)->fp = (BGZF *)0x0;
              }
              prVar12 = refs_load_fai(*pprVar1,pcVar14,0);
              if (prVar12 != (refs_t *)0x0) {
                *pprVar1 = prVar12;
                if (prVar12->fp != (BGZF *)0x0) {
                  iVar6 = bgzf_close(prVar12->fp);
                  if (iVar6 != 0) goto LAB_0012f679;
                  (*pprVar1)->fp = (BGZF *)0x0;
                }
                if (((*pprVar1)->fn != (char *)0x0) &&
                   (iVar6 = refs2id(*pprVar1,fd->header), iVar6 != -1)) {
                  iVar6 = -1;
                  if ((*pprVar1)->ref_id != (ref_entry **)0x0) {
                    iVar6 = -(uint)((*pprVar1)->ref_id[id] == (ref_entry *)0x0);
                  }
                  goto LAB_0012f67e;
                }
              }
            }
            goto LAB_0012f679;
          }
          if (fd->verbose != 0) {
            cram_get_ref_cold_1();
          }
          if ((local_3060 == (char *)0x0) || (*local_3060 == '\0')) {
LAB_0012f490:
            mf = open_path_mfile(pSVar10->str + 3,pcVar15,(char *)0x0);
            if (mf == (mFILE *)0x0) goto LAB_0012f58e;
            pcVar15 = (char *)mfsteal(mf,&local_3038[0].st_dev);
            e->seq = pcVar15;
            e->length = local_3038[0].st_dev;
            if ((local_3060 != (char *)0x0) && (*local_3060 != '\0')) {
              expand_cache_path(local_2038,local_3060,pSVar10->str + 3);
              if (fd->verbose != 0) {
                fprintf(_stderr,"Path=\'%s\'\n",local_2038);
              }
              mkdir_prefix(local_2038,0x3ff);
              do {
                sprintf((char *)local_3038,"%s.tmp_%d",local_2038);
                __s = fopen((char *)local_3038,"wx");
                if (__s != (FILE *)0x0) {
                  __n = e->length;
                  sVar13 = fwrite(e->seq,1,__n,__s);
                  if (__n != sVar13) {
                    perror(local_2038);
                  }
                  iVar7 = paranoid_fclose((FILE *)__s);
                  if ((iVar7 == -1) || (iVar7 = chmod((char *)local_3038,0x124), iVar7 != 0)) {
                    unlink((char *)local_3038);
                  }
                  else {
                    rename((char *)local_3038,local_2038);
                  }
                  goto LAB_0012f92c;
                }
                piVar11 = __errno_location();
              } while (*piVar11 == 0x11);
              perror((char *)local_3038);
              iVar6 = 0;
LAB_0012f92c:
              if (__s == (FILE *)0x0) goto LAB_0012f67e;
            }
            iVar6 = 0;
          }
          else {
            expand_cache_path(local_2038,local_3060,pSVar10->str + 3);
            iVar7 = stat(local_2038,local_3038);
            bVar5 = true;
            if ((iVar7 == 0) && (pBVar9 = bgzf_open(local_2038,"r"), pBVar9 != (BGZF *)0x0)) {
              e->length = local_3038[0].st_size;
              e->offset = 0;
              e->bases_per_line = 0;
              e->line_length = 0;
              pcVar14 = string_dup((*pprVar1)->pool,local_2038);
              e->fn = pcVar14;
              if (((*pprVar1)->fp == (BGZF *)0x0) ||
                 (iVar6 = bgzf_close((*pprVar1)->fp), iVar6 == 0)) {
                prVar12 = *pprVar1;
                prVar12->fp = pBVar9;
                prVar12->fn = e->fn;
                bVar5 = false;
                iVar6 = 0;
              }
              else {
                iVar6 = -1;
                bVar5 = false;
              }
            }
            if (bVar5) goto LAB_0012f490;
          }
        }
LAB_0012f67e:
        if (iVar6 == -1) {
          cram_get_ref_cold_2();
          return (char *)0x0;
        }
        prVar12 = fd->refs;
        e = prVar12->ref_id[id];
        if (((-1 < id) && (fd->unsorted != 0)) &&
           (prVar8 = prVar12->ref_id[(uint)id], prVar8->seq != (char *)0x0)) {
          if (prVar12->last_id == id) {
            prVar12->last_id = -1;
          }
          piVar2 = &prVar8->count;
          *piVar2 = *piVar2 + 1;
        }
      }
      if (end < 1) {
        end = (int)e->length;
      }
      lVar3 = e->length;
      if (lVar3 <= end) {
        end = (int)lVar3;
      }
      if (start < 1) {
        __assert_fail("start >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                      ,0x934,"char *cram_get_ref(cram_fd *, int, int, int)");
      }
      if (((double)lVar3 * 0.5 <= (double)(end - start)) || (start_00 = start, fd->shared_ref != 0))
      {
        start_00 = 1;
        end = (int)lVar3;
      }
      if (((fd->shared_ref == 0) && (e->seq == (char *)0x0)) && ((start_00 != 1 || (lVar3 != end))))
      {
        if (id < 0) {
          if (fd->ref_free != (char *)0x0) {
            free(fd->ref_free);
            fd->ref_free = (char *)0x0;
          }
          fd->ref = (char *)0x0;
          fd->ref_id = id;
          prVar12 = fd->refs;
        }
        else {
          prVar12 = *pprVar1;
          pcVar15 = e->fn;
          iVar6 = strcmp(prVar12->fn,pcVar15);
          if ((iVar6 != 0) || (prVar12->fp == (BGZF *)0x0)) {
            if ((prVar12->fp != (BGZF *)0x0) && (iVar6 = bgzf_close(prVar12->fp), iVar6 != 0)) {
              return (char *)0x0;
            }
            pcVar14 = e->fn;
            (*pprVar1)->fn = pcVar14;
            pBVar9 = bgzf_open_ref(pcVar14,pcVar15);
            prVar12 = *pprVar1;
            prVar12->fp = pBVar9;
            if (pBVar9 == (BGZF *)0x0) goto LAB_0012f899;
          }
          pcVar15 = load_ref_portion(fd->refs->fp,e,start_00,end);
          fd->ref = pcVar15;
          if (pcVar15 != (char *)0x0) {
            if (fd->ref_free != (char *)0x0) {
              free(fd->ref_free);
            }
            fd->ref_id = id;
            fd->ref_start = start_00;
            fd->ref_end = end;
            pcVar15 = fd->ref;
            fd->ref_free = pcVar15;
            pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            return pcVar15 + ((ulong)(uint)start - (ulong)start_00);
          }
          prVar12 = *pprVar1;
        }
LAB_0012f899:
        pthread_mutex_unlock((pthread_mutex_t *)&prVar12->lock);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return (char *)0x0;
      }
      if (id < 0) {
        fd->ref = (char *)0x0;
        pcVar15 = (char *)0x0;
      }
      else {
        prVar12 = *pprVar1;
        if (e->seq == (char *)0x0) {
          prVar8 = cram_ref_load(prVar12,id);
          if (prVar8 == (ref_entry *)0x0) {
            pthread_mutex_unlock((pthread_mutex_t *)&(*pprVar1)->lock);
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          }
          else if (fd->unsorted != 0) {
            prVar12 = *pprVar1;
            prVar4 = prVar12->ref_id[(uint)id];
            if (prVar4->seq != (char *)0x0) {
              if (prVar12->last_id == id) {
                prVar12->last_id = -1;
              }
              piVar2 = &prVar4->count;
              *piVar2 = *piVar2 + 1;
            }
          }
          if (prVar8 == (ref_entry *)0x0) {
            return (char *)0x0;
          }
        }
        else {
          prVar8 = prVar12->ref_id[(uint)id];
          if (prVar8->seq != (char *)0x0) {
            if (prVar12->last_id == id) {
              prVar12->last_id = -1;
            }
            piVar2 = &prVar8->count;
            *piVar2 = *piVar2 + 1;
          }
        }
        fd->ref = (char *)0x0;
        fd->ref_start = 1;
        fd->ref_end = (int)e->length;
        fd->ref_id = id;
        pcVar15 = fd->refs->ref_id[id]->seq + ((ulong)(uint)start - 1);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&(*pprVar1)->lock);
      goto LAB_0012f2c0;
    }
  }
  pcVar15 = (char *)0x0;
  fprintf(_stderr,"No reference found for id %d\n",(ulong)(uint)id);
LAB_0012f2c0:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return pcVar15;
}

Assistant:

char *cram_get_ref(cram_fd *fd, int id, int start, int end) {
    ref_entry *r;
    char *seq;
    int ostart = start;

    if (id == -1)
	return NULL;

    /* FIXME: axiomatic query of r->seq being true?
     * Or shortcut for unsorted data where we load once and never free?
     */

    //fd->shared_ref = 1; // hard code for now to simplify things

    pthread_mutex_lock(&fd->ref_lock);

    RP("%d cram_get_ref on fd %p, id %d, range %d..%d\n", gettid(), fd, id, start, end);

    /*
     * Unsorted data implies we want to fetch an entire reference at a time.
     * We just deal with this at the moment by claiming we're sharing
     * references instead, which has the same requirement.
     */
    if (fd->unsorted)
	fd->shared_ref = 1;


    /* Sanity checking: does this ID exist? */
    if (id >= fd->refs->nref) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (!fd->refs || !fd->refs->ref_id[id]) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (!(r = fd->refs->ref_id[id])) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }


    /*
     * It has an entry, but may not have been populated yet.
     * Any manually loaded .fai files have their lengths known.
     * A ref entry computed from @SQ lines (M5 or UR field) will have
     * r->length == 0 unless it's been loaded once and verified that we have
     * an on-disk filename for it.
     *
     * 19 Sep 2013: Moved the lock here as the cram_populate_ref code calls
     * open_path_mfile and libcurl, which isn't multi-thread safe unless I
     * rewrite my code to have one curl handle per thread.
     */
    pthread_mutex_lock(&fd->refs->lock);
    if (r->length == 0) {
	if (cram_populate_ref(fd, id, r) == -1) {
	    fprintf(stderr, "Failed to populate reference for id %d\n", id);
	    pthread_mutex_unlock(&fd->refs->lock);
	    pthread_mutex_unlock(&fd->ref_lock);
	    return NULL;
	}
	r = fd->refs->ref_id[id];
	if (fd->unsorted)
	    cram_ref_incr_locked(fd->refs, id);
    }


    /*
     * We now know that we the filename containing the reference, so check
     * for limits. If it's over half the reference we'll load all of it in
     * memory as this will speed up subsequent calls.
     */
    if (end < 1)
	end = r->length;
    if (end >= r->length)
	end  = r->length; 
    assert(start >= 1);

    if (end - start >= 0.5*r->length || fd->shared_ref) {
	start = 1;
	end = r->length;
    }
    
    /*
     * Maybe we have it cached already? If so use it.
     *
     * Alternatively if we don't have the sequence but we're sharing
     * references and/or are asking for the entire length of it, then
     * load the full reference into the refs structure and return
     * a pointer to that one instead.
     */
    if (fd->shared_ref || r->seq || (start == 1 && end == r->length)) {
	char *cp;

	if (id >= 0) {
	    if (r->seq) {
		cram_ref_incr_locked(fd->refs, id);
	    } else {
		ref_entry *e;
		if (!(e = cram_ref_load(fd->refs, id))) {
		    pthread_mutex_unlock(&fd->refs->lock);
		    pthread_mutex_unlock(&fd->ref_lock);
		    return NULL;
		}

		/* unsorted data implies cache ref indefinitely, to avoid
		 * continually loading and unloading.
		 */
		if (fd->unsorted)
		    cram_ref_incr_locked(fd->refs, id);
	    }	    

	    fd->ref = NULL; /* We never access it directly */
	    fd->ref_start = 1;
	    fd->ref_end   = r->length;
	    fd->ref_id    = id;

	    cp = fd->refs->ref_id[id]->seq + ostart-1;
	} else {
	    fd->ref = NULL;
	    cp = NULL;
	}

	RP("%d cram_get_ref returning for id %d, count %d\n", gettid(), id, (int)r->count);

	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return cp;
    }

    /*
     * Otherwise we're not sharing, we don't have a copy of it already and
     * we're only asking for a small portion of it.
     *
     * In this case load up just that segment ourselves, freeing any old
     * small segments in the process.
     */

    /* Unmapped ref ID */
    if (id < 0) {
	if (fd->ref_free) {
	    free(fd->ref_free);
	    fd->ref_free = NULL;
	}
	fd->ref = NULL;
	fd->ref_id = id;
	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    /* Open file if it's not already the current open reference */
    if (strcmp(fd->refs->fn, r->fn) || fd->refs->fp == NULL) {
	if (fd->refs->fp)
	    if (bgzf_close(fd->refs->fp) != 0)
		return NULL;
	fd->refs->fn = r->fn;
	if (!(fd->refs->fp = bgzf_open_ref(fd->refs->fn, "r"))) {
	    pthread_mutex_unlock(&fd->refs->lock);
	    pthread_mutex_unlock(&fd->ref_lock);
	    return NULL;
	}
    }

    if (!(fd->ref = load_ref_portion(fd->refs->fp, r, start, end))) {
	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (fd->ref_free)
	free(fd->ref_free);

    fd->ref_id    = id;
    fd->ref_start = start;
    fd->ref_end   = end;
    fd->ref_free = fd->ref;
    seq = fd->ref;

    pthread_mutex_unlock(&fd->refs->lock);
    pthread_mutex_unlock(&fd->ref_lock);

    return seq + ostart - start;
}